

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool bloaty::MmapInputFile::DoTryOpen
               (string_view filename,
               unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *file)

{
  InputFile *pIVar1;
  string_view filename_00;
  int iVar2;
  char *pcVar3;
  InputFile *this;
  int *piVar4;
  bool bVar5;
  Arg *in_R9;
  Arg *a1;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view data;
  FileDescriptor fd;
  string local_160;
  string_view filename_local;
  string str;
  Arg local_110;
  size_t local_e0;
  char *pcStack_d8;
  stat buf;
  
  filename_local._M_str = filename._M_str;
  filename_local._M_len = filename._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&str,&filename_local,(allocator<char> *)&buf);
  fd.fd_ = open(str._M_dataplus._M_p,0);
  if (fd.fd_ < 0) {
    local_e0 = filename_local._M_len;
    pcStack_d8 = filename_local._M_str;
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    local_110.piece_ = absl::NullSafeStringView(pcVar3);
    format._M_str = (char *)&local_e0;
    format._M_len = (size_t)"couldn\'t open file \'$0\': $1\n";
    absl::Substitute_abi_cxx11_(&local_160,(absl *)0x1c,format,&local_110,in_R9);
    std::operator<<((ostream *)&std::cerr,(string *)&local_160);
  }
  else {
    iVar2 = fstat(fd.fd_,(stat *)&buf);
    if (iVar2 < 0) {
      local_e0 = filename_local._M_len;
      pcStack_d8 = filename_local._M_str;
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      local_110.piece_ = absl::NullSafeStringView(pcVar3);
      format_00._M_str = (char *)&local_e0;
      format_00._M_len = (size_t)"couldn\'t stat file \'$0\': $1\n";
      absl::Substitute_abi_cxx11_(&local_160,(absl *)0x1c,format_00,&local_110,in_R9);
      std::operator<<((ostream *)&std::cerr,(string *)&local_160);
    }
    else {
      a1 = (Arg *)0x0;
      pcVar3 = (char *)mmap((void *)0x0,buf.st_size,1,1,fd.fd_,0);
      if (pcVar3 != (char *)0xffffffffffffffff) {
        this = (InputFile *)operator_new(0x38);
        filename_00._M_str = filename_local._M_str;
        filename_00._M_len = filename_local._M_len;
        data._M_str = pcVar3;
        data._M_len = buf.st_size;
        MmapInputFile((MmapInputFile *)this,filename_00,data);
        pIVar1 = (file->_M_t).
                 super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>
                 .super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
        (file->_M_t).
        super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
        super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
        super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl = this;
        bVar5 = true;
        if (pIVar1 != (InputFile *)0x0) {
          (*pIVar1->_vptr_InputFile[2])();
        }
        goto LAB_0017a6d2;
      }
      local_e0 = filename_local._M_len;
      pcStack_d8 = filename_local._M_str;
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      local_110.piece_ = absl::NullSafeStringView(pcVar3);
      format_01._M_str = (char *)&local_e0;
      format_01._M_len = (size_t)"couldn\'t mmap file \'$0\': $1";
      absl::Substitute_abi_cxx11_(&local_160,(absl *)0x1b,format_01,&local_110,a1);
      std::operator<<((ostream *)&std::cerr,(string *)&local_160);
    }
  }
  std::__cxx11::string::~string((string *)&local_160);
  bVar5 = false;
LAB_0017a6d2:
  FileDescriptor::~FileDescriptor(&fd);
  std::__cxx11::string::~string((string *)&str);
  return bVar5;
}

Assistant:

bool MmapInputFile::DoTryOpen(std::string_view filename,
                              std::unique_ptr<InputFile>& file) {
  std::string str(filename);
  FileDescriptor fd(open(str.c_str(), O_RDONLY));
  struct stat buf;
  const char* map;

  if (fd.fd() < 0) {
    std::cerr << absl::Substitute("couldn't open file '$0': $1\n", filename,
                                  strerror(errno));
    return false;
  }

  if (fstat(fd.fd(), &buf) < 0) {
    std::cerr << absl::Substitute("couldn't stat file '$0': $1\n", filename,
                                  strerror(errno));
    return false;
  }

  map = static_cast<char*>(
      mmap(nullptr, buf.st_size, PROT_READ, MAP_SHARED, fd.fd(), 0));

  if (map == MAP_FAILED) {
    std::cerr << absl::Substitute("couldn't mmap file '$0': $1", filename,
                                  strerror(errno));
    return false;
  }

  file.reset(new MmapInputFile(filename, string_view(map, buf.st_size)));
  return true;
}